

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O2

void chrono::turtlebot::AddRevoluteJoint
               (shared_ptr<chrono::ChBodyAuxRef> *body_1,shared_ptr<chrono::ChBodyAuxRef> *body_2,
               shared_ptr<chrono::ChBodyAuxRef> *chassis,ChSystem *system,
               ChVector<double> *rel_joint_pos,ChQuaternion<double> *rel_joint_rot)

{
  ChFrame<double> *this;
  shared_ptr<chrono::ChLinkLockRevolute> revo;
  ChFrame<double> X_GC;
  ChFrame<double> X_PC;
  __shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2> local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> local_198 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> local_188 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  double local_178;
  double dStack_170;
  double dStack_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  this = (ChFrame<double> *)
         (**(code **)(*(long *)(chassis->
                               super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr + 0x1f0))();
  ChFrame<double>::ChFrame(&local_b8,rel_joint_pos,rel_joint_rot);
  ChFrame<double>::operator*(&local_140,this,&local_b8);
  chrono_types::make_shared<chrono::ChLinkLockRevolute,_0>();
  std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            (local_188,&body_1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            (local_198,&body_2->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
            );
  local_178 = local_140.coord.pos.m_data[0];
  dStack_170 = local_140.coord.pos.m_data[1];
  dStack_168 = local_140.coord.pos.m_data[2];
  dStack_160 = local_140.coord.rot.m_data[0];
  local_158 = local_140.coord.rot.m_data[1];
  dStack_150 = local_140.coord.rot.m_data[2];
  local_148 = local_140.coord.rot.m_data[3];
  (**(code **)(*(long *)local_1b8._M_ptr + 0x250))(local_1b8._M_ptr,local_188,local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180);
  std::__shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChLinkLockRevolute,void>(local_1a8,&local_1b8);
  (**(code **)(*(long *)system + 0x138))(system,local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
  return;
}

Assistant:

void AddRevoluteJoint(std::shared_ptr<ChBodyAuxRef> body_1,
                      std::shared_ptr<ChBodyAuxRef> body_2,
                      std::shared_ptr<ChBodyAuxRef> chassis,
                      ChSystem* system,
                      const ChVector<>& rel_joint_pos,
                      const ChQuaternion<>& rel_joint_rot) {
    const ChFrame<>& X_GP = chassis->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(rel_joint_pos, rel_joint_rot);            // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                            // global -> child

    auto revo = chrono_types::make_shared<ChLinkLockRevolute>();
    revo->Initialize(body_1, body_2, ChCoordsys<>(X_GC.GetCoord().pos, X_GC.GetCoord().rot));
    system->AddLink(revo);
}